

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O2

void enqueue_children(min_heap *to_expand,node *parent,Pyraminx *pyraminx,int g)

{
  ulong in_RAX;
  int i;
  int iVar1;
  Corner ref_corner;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    uStack_38 = uStack_38 & 0xffffffff;
    enqueue_corner(to_expand,parent,pyraminx,(Corner *)((long)&uStack_38 + 4),g);
  }
  return;
}

Assistant:

void enqueue_children(min_heap& to_expand, const node* parent, Pyraminx& pyraminx, int g){
    for(int i = 0; i < 4; i++){
        Corner ref_corner;
        switch (i)
        {
        case 0:
            ref_corner = Corner::U;
            break;
        case 1:
            ref_corner = Corner::L;
            break;
        case 2:
            ref_corner = Corner::R;
            break;
        case 3:
            ref_corner = Corner::B;
            break;
        }
        enqueue_corner(to_expand, parent, pyraminx, ref_corner, g);
    }
}